

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_s32__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  size_t i;
  drwav_uint64 dVar4;
  drwav_uint64 dVar5;
  ulong samplesToRead_00;
  drwav_uint64 dVar6;
  uint uVar7;
  ulong uVar8;
  uchar sampleData [4096];
  double local_1038 [513];
  
  uVar3 = pWav->bitsPerSample;
  if ((uVar3 < 8) || ((uVar3 & 7) != 0)) {
    uVar1 = (pWav->fmt).channels;
    uVar2 = (pWav->fmt).blockAlign;
    uVar3 = uVar2 / uVar1;
    if (uVar2 < uVar1) {
      return 0;
    }
  }
  else {
    uVar3 = uVar3 >> 3;
  }
  uVar7 = (uint)uVar3;
  dVar6 = 0;
  if (samplesToRead != 0) {
    uVar8 = (ulong)(ushort)(0x1000 / uVar7);
    do {
      samplesToRead_00 = uVar8;
      if (samplesToRead < uVar8) {
        samplesToRead_00 = samplesToRead;
      }
      dVar4 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar4 == 0) {
        return dVar6;
      }
      if (uVar7 == 8) {
        if (pBufferOut != (drwav_int32 *)0x0) {
          dVar5 = 0;
          do {
            pBufferOut[dVar5] = (int)(local_1038[dVar5] * 2147483648.0);
            dVar5 = dVar5 + 1;
          } while (dVar4 != dVar5);
        }
      }
      else if (uVar7 == 4) {
        if (pBufferOut != (drwav_int32 *)0x0) {
          dVar5 = 0;
          do {
            pBufferOut[dVar5] = (int)(*(float *)((long)local_1038 + dVar5 * 4) * 2.1474836e+09);
            dVar5 = dVar5 + 1;
          } while (dVar4 != dVar5);
        }
      }
      else {
        memset(pBufferOut,0,dVar4 * 4);
      }
      pBufferOut = pBufferOut + dVar4;
      dVar6 = dVar6 + dVar4;
      samplesToRead = samplesToRead - dVar4;
    } while (samplesToRead != 0);
  }
  return dVar6;
}

Assistant:

drwav_uint64 drwav_read_s32__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s32(pBufferOut, sampleData, (size_t)samplesRead, bytesPerSample);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}